

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  SPIRType *pSVar1;
  SPIRType *this_00;
  ID id_00;
  int local_1c0;
  uint32_t ptr_type_id;
  string local_1b8;
  DummySamplerForCombinedImageHandler handler;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  handler.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_00465578;
  handler.need_dummy_sampler = false;
  handler.compiler = this;
  func = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&handler.super_OpcodeHandler);
  id_00.id = 0;
  if (handler.need_dummy_sampler == true) {
    id = ParsedIR::increase_bound_by(&this->ir,3);
    local_180._32_8_ = local_180 + 0x38;
    local_180._0_8_ = &PTR__SPIRType_00464260;
    local_180._8_8_ = 0;
    local_180._16_4_ = 0;
    local_180._20_4_ = 1;
    local_180._24_4_ = 1;
    local_180._40_8_ = 0;
    local_180._48_8_ = 8;
    local_180._88_8_ = local_180 + 0x70;
    local_180._96_8_ = 0;
    local_180._104_8_ = 8;
    local_180._120_4_ = 0;
    local_180[0x7c] = false;
    local_180[0x7d] = false;
    local_180._128_4_ = StorageClassGeneric;
    local_180._136_8_ = local_180 + 0xa0;
    local_180._144_8_ = 0;
    local_180._152_8_ = 8;
    local_c0 = local_a8;
    local_b8 = 0;
    local_b0 = 8;
    local_88.id = 0;
    local_70._0_4_ = 0;
    local_70._4_4_ = 0;
    local_68 = &p_Stack_38;
    local_60 = 1;
    local_58._M_nxt = (_Hash_node_base *)0x0;
    sStack_50 = 0;
    local_48 = 1.0;
    local_40 = 0;
    p_Stack_38 = (__node_base_ptr)0x0;
    ptr_type_id = id + 1;
    pSVar1 = set<spirv_cross::SPIRType>(this,id);
    *(undefined4 *)&(pSVar1->super_IVariant).field_0xc = 0x12;
    this_00 = set<spirv_cross::SPIRType>(this,id + 1);
    SPIRType::operator=(this_00,pSVar1);
    (this_00->super_IVariant).self.id = id;
    this_00->storage = StorageClassUniformConstant;
    id_00.id = id + 2;
    this_00->pointer = true;
    (this_00->parent_type).id = id;
    local_1b8._M_dataplus._M_p._0_4_ = 0;
    local_1c0 = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,id_00.id,&ptr_type_id,(StorageClass *)&local_1b8,&local_1c0);
    ::std::__cxx11::string::string
              ((string *)&local_1b8,"SPIRV_Cross_DummySampler",(allocator *)&local_1c0);
    ParsedIR::set_name(&this->ir,id_00,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    this->dummy_sampler_id = id_00.id;
    SPIRType::~SPIRType((SPIRType *)local_180);
  }
  return (VariableID)id_00.id;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		SPIRType sampler_type;
		auto &sampler = set<SPIRType>(type_id);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}